

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall spv::Builder::transferAccessChainSwizzle(Builder *this,bool dynamic)

{
  Id IVar1;
  uint *puVar2;
  uint *puVar3;
  pointer puVar4;
  ulong uVar5;
  uint local_14;
  
  puVar2 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = (long)puVar3 - (long)puVar2;
  IVar1 = (this->accessChain).component;
  if (uVar5 < 5 && (IVar1 != 0 || puVar3 != puVar2)) {
    if (uVar5 == 4) {
      if (IVar1 != 0) {
        __assert_fail("accessChain.component == NoResult",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0x10f2,"void spv::Builder::transferAccessChainSwizzle(bool)");
      }
      makeUintConstant(this,*puVar2,false);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&(this->accessChain).indexChain,&local_14);
      puVar4 = (this->accessChain).swizzle.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->accessChain).swizzle.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar4) {
        (this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar4;
      }
      (this->accessChain).preSwizzleBaseType = 0;
    }
    else if (dynamic && IVar1 != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&(this->accessChain).indexChain,&(this->accessChain).component);
      (this->accessChain).component = 0;
      (this->accessChain).preSwizzleBaseType = 0;
    }
  }
  return;
}

Assistant:

void Builder::transferAccessChainSwizzle(bool dynamic)
{
    // non existent?
    if (accessChain.swizzle.size() == 0 && accessChain.component == NoResult)
        return;

    // too complex?
    // (this requires either a swizzle, or generating code for a dynamic component)
    if (accessChain.swizzle.size() > 1)
        return;

    // single component, either in the swizzle and/or dynamic component
    if (accessChain.swizzle.size() == 1) {
        assert(accessChain.component == NoResult);
        // handle static component selection
        accessChain.indexChain.push_back(makeUintConstant(accessChain.swizzle.front()));
        accessChain.swizzle.clear();
        accessChain.preSwizzleBaseType = NoType;
    } else if (dynamic && accessChain.component != NoResult) {
        assert(accessChain.swizzle.size() == 0);
        // handle dynamic component
        accessChain.indexChain.push_back(accessChain.component);
        accessChain.preSwizzleBaseType = NoType;
        accessChain.component = NoResult;
    }
}